

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O2

void SetImplicitArgs(TArray<PType_*,_PType_*> *args,TArray<unsigned_int,_unsigned_int> *argflags,
                    TArray<FName,_FName> *argnames,PStruct *cls,DWORD funcflags,int useflags)

{
  uint __line;
  PStruct *type;
  char *__assertion;
  PPointer *local_40;
  FName local_34;
  
  if ((args == (TArray<PType_*,_PType_*> *)0x0) || (args->Count == 0)) {
    if ((argflags == (TArray<unsigned_int,_unsigned_int> *)0x0) || (argflags->Count == 0)) {
      if ((funcflags & 2) != 0) {
        if (args != (TArray<PType_*,_PType_*> *)0x0) {
          local_40 = NewPointer((PType *)cls,false);
          TArray<PType_*,_PType_*>::Push(args,(PType **)&local_40);
        }
        if (argflags != (TArray<unsigned_int,_unsigned_int> *)0x0) {
          local_40 = (PPointer *)CONCAT44(local_40._4_4_,0x1010);
          TArray<unsigned_int,_unsigned_int>::Push(argflags,(uint *)&local_40);
        }
        if (argnames != (TArray<FName,_FName> *)0x0) {
          local_40 = (PPointer *)CONCAT44(local_40._4_4_,0x271);
          TArray<FName,_FName>::Push(argnames,(FName *)&local_40);
        }
      }
      if ((funcflags & 4) != 0) {
        if (args != (TArray<PType_*,_PType_*> *)0x0) {
          if ((useflags & 0xcU) == 0) {
            local_40 = NewPointer((PType *)cls,false);
            TArray<PType_*,_PType_*>::Push(args,(PType **)&local_40);
          }
          else {
            local_40 = NewPointer((PType *)AActor::RegistrationInfo.MyClass,false);
            TArray<PType_*,_PType_*>::Insert(args,0,(PType **)&local_40);
          }
          FName::FName(&local_34,"FStateParamInfo");
          type = NewStruct(&local_34,(PTypeBase *)0x0);
          local_40 = NewPointer((PType *)type,false);
          TArray<PType_*,_PType_*>::Push(args,(PType **)&local_40);
        }
        if (argflags != (TArray<unsigned_int,_unsigned_int> *)0x0) {
          local_40._0_4_ = 0x1010;
          TArray<unsigned_int,_unsigned_int>::Push(argflags,(uint *)&local_40);
          local_40 = (PPointer *)CONCAT44(local_40._4_4_,0x1010);
          TArray<unsigned_int,_unsigned_int>::Push(argflags,(uint *)&local_40);
        }
        if (argnames != (TArray<FName,_FName> *)0x0) {
          local_40._0_4_ = 0x272;
          TArray<FName,_FName>::Push(argnames,(FName *)&local_40);
          local_40 = (PPointer *)CONCAT44(local_40._4_4_,0x273);
          TArray<FName,_FName>::Push(argnames,(FName *)&local_40);
        }
      }
      return;
    }
    __assertion = "argflags == nullptr || argflags->Size() == 0";
    __line = 0x6f;
  }
  else {
    __assertion = "args == nullptr || args->Size() == 0";
    __line = 0x6e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef.cpp"
                ,__line,
                "void SetImplicitArgs(TArray<PType *> *, TArray<DWORD> *, TArray<FName> *, PStruct *, DWORD, int)"
               );
}

Assistant:

void SetImplicitArgs(TArray<PType *> *args, TArray<DWORD> *argflags, TArray<FName> *argnames, PStruct *cls, DWORD funcflags, int useflags)
{
	// Must be called before adding any other arguments.
	assert(args == nullptr || args->Size() == 0);
	assert(argflags == nullptr || argflags->Size() == 0);

	if (funcflags & VARF_Method)
	{
		// implied self pointer
		if (args != nullptr)		args->Push(NewPointer(cls)); 
		if (argflags != nullptr)	argflags->Push(VARF_Implicit | VARF_ReadOnly);
		if (argnames != nullptr)	argnames->Push(NAME_self);
	}
	if (funcflags & VARF_Action)
	{
		// implied caller and callingstate pointers
		if (args != nullptr)
		{
			// Special treatment for weapons and CustomInventory flagged functions: 'self' is not the defining class but the actual user of the item, so this pointer must be of type 'Actor'
			if (useflags & (SUF_WEAPON|SUF_ITEM))
			{
				args->Insert(0, NewPointer(RUNTIME_CLASS(AActor)));	// this must go in before the real pointer to the containing class.
			}
			else
			{
				args->Push(NewPointer(cls));
			}
			args->Push(NewPointer(NewStruct("FStateParamInfo", nullptr)));
		}
		if (argflags != nullptr)
		{
			argflags->Push(VARF_Implicit | VARF_ReadOnly);
			argflags->Push(VARF_Implicit | VARF_ReadOnly);
		}
		if (argnames != nullptr)
		{
			argnames->Push(NAME_invoker);
			argnames->Push(NAME_stateinfo);
		}
	}
}